

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O1

void __thiscall ot::commissioner::DtlsSession::HandleEvent(DtlsSession *this,short aFlags)

{
  State SVar1;
  undefined4 uVar2;
  char *pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  byte bVar5;
  uint uVar6;
  char *from;
  undefined6 in_register_00000032;
  _Alloc_hider _Var7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *to;
  bool bVar8;
  string_view fmt;
  format_args args;
  Error error;
  writer write;
  type local_1a8;
  undefined1 *local_1a0;
  long local_198;
  undefined1 local_190 [20];
  undefined4 local_17c;
  undefined1 local_178 [8];
  type local_170;
  undefined4 uStack_16c;
  char *local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *pfStack_150;
  code *local_148;
  code *pcStack_140;
  code *local_138;
  string local_130;
  undefined1 local_110 [32];
  undefined1 local_f0 [8];
  _Alloc_hider local_e8;
  char local_d8 [16];
  string local_c8;
  type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  type local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  type local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_1a8 = none_type;
  local_1a0 = local_190;
  local_198 = 0;
  local_190[0] = 0;
  if ((this->mIsServer == true) && (this->mIsClientIdSet == false)) {
    SetClientTransportId((Error *)local_178,this);
    uVar2 = local_178._0_4_;
    local_1a8 = local_178._0_4_;
    std::__cxx11::string::operator=((string *)&local_1a0,(string *)&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uStack_16c,local_170) != &local_160) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(uStack_16c,local_170));
    }
    if (uVar2 != none_type) goto LAB_001e4858;
  }
  if (this->mState == kConnected) {
LAB_001e45b3:
    if (((aFlags & 2U) != 0) && (local_1a8 == none_type)) {
      do {
        Read((Error *)local_178,this);
        uVar2 = local_178._0_4_;
        local_1a8 = local_178._0_4_;
        std::__cxx11::string::operator=((string *)&local_1a0,(string *)&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_16c,local_170) != &local_160) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_16c,local_170));
        }
      } while (uVar2 == none_type);
    }
    if ((aFlags & 4U) == 0) {
LAB_001e4800:
      uVar6 = 0;
    }
    else {
      local_58 = local_1a8;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>((string *)local_50,local_1a0,local_1a0 + local_198);
      if (cstring_type < local_58) goto LAB_001e4800;
      uVar6 = 0x1201 >> ((byte)local_58 & 0x1f);
    }
    if (((aFlags & 4U) != 0) && (local_50[0] != local_40)) {
      operator_delete(local_50[0]);
    }
    if ((uVar6 & 1) == 0) goto LAB_001e4858;
    TryWrite((Error *)local_178,this);
    local_1a8 = local_178._0_4_;
    std::__cxx11::string::operator=((string *)&local_1a0,(string *)&local_170);
    paVar4 = &local_160;
    _Var7._M_p = (pointer)CONCAT44(uStack_16c,local_170);
LAB_001e484e:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var7._M_p == paVar4) goto LAB_001e4858;
  }
  else {
    if (this->mState != kConnecting) {
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      local_17c = (int)CONCAT62(in_register_00000032,aFlags);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"dtls","");
      local_178 = (undefined1  [8])0x10000000e;
      local_170 = string_type;
      from = "session(={}) received event {:X} in state {}";
      local_168 = "session(={}) received event {:X} in state {}";
      local_160._M_allocated_capacity = 0x2c;
      local_160._8_8_ = 0x300000000;
      local_148 = ::fmt::v10::detail::
                  parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
      pcStack_140 = ::fmt::v10::detail::
                    parse_format_specs<short,fmt::v10::detail::compile_parse_context<char>>;
      local_138 = ::fmt::v10::detail::
                  parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pfStack_150 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                    local_178;
      local_110._0_8_ =
           (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)local_178;
      do {
        if (from == "") break;
        to = from;
        if (*from == '{') {
LAB_001e46e2:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)local_110,from,to);
          from = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,short,std::__cxx11::string>&>
                           (to,"",(format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long>
                                   *)local_178);
          bVar8 = true;
        }
        else {
          to = from + 1;
          bVar8 = to != "";
          if (bVar8) {
            if (*to != '{') {
              pcVar3 = from + 2;
              do {
                to = pcVar3;
                bVar8 = to != "";
                if (to == "") goto LAB_001e46de;
                pcVar3 = to + 1;
              } while (*to != '{');
            }
            bVar8 = true;
          }
LAB_001e46de:
          if (bVar8) goto LAB_001e46e2;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)local_110,from,"");
          bVar8 = false;
        }
      } while (bVar8);
      GetStateString_abi_cxx11_((string *)local_110,this);
      local_168 = (char *)(ulong)(uint)(int)(short)local_17c;
      local_160._8_8_ = local_110._0_8_;
      pfStack_150 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                    local_110._8_8_;
      fmt.size_ = 0xd1e;
      fmt.data_ = (char *)0x2c;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)local_178;
      local_178 = (undefined1  [8])this;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_c8,(v10 *)"session(={}) received event {:X} in state {}",fmt,args);
      Log(kDebug,&local_130,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      if ((format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
          local_110._0_8_ !=
          (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
          (local_110 + 0x10)) {
        operator_delete((void *)local_110._0_8_);
      }
      paVar4 = &local_130.field_2;
      _Var7._M_p = local_130._M_dataplus._M_p;
      goto LAB_001e484e;
    }
    Handshake((Error *)local_178,this);
    uVar2 = local_178._0_4_;
    local_1a8 = local_178._0_4_;
    std::__cxx11::string::operator=((string *)&local_1a0,(string *)&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uStack_16c,local_170) != &local_160) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(uStack_16c,local_170));
    }
    local_a8 = uVar2;
    local_a0[0] = &local_90;
    std::__cxx11::string::_M_construct<char*>((string *)local_a0,local_1a0,local_1a0 + local_198);
    if ((local_a8 < string_type) && ((0x1201U >> (local_a8 & 0x1f) & 1) != 0)) {
      SVar1 = this->mState;
      if (local_a0[0] != &local_90) {
        operator_delete(local_a0[0]);
      }
      if (SVar1 != kConnected) goto LAB_001e4858;
      goto LAB_001e45b3;
    }
    _Var7._M_p = (pointer)local_a0[0];
    if (local_a0[0] == &local_90) goto LAB_001e4858;
  }
  operator_delete(_Var7._M_p);
LAB_001e4858:
  local_80 = local_1a8;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char*>((string *)local_78,local_1a0,local_1a0 + local_198);
  bVar8 = cstring_type < local_80;
  bVar5 = (byte)local_80;
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  if ((0xdfeU >> (bVar5 & 0x1f) & 1) != 0 || bVar8) {
    local_f0._0_4_ = local_1a8;
    local_e8._M_p = local_d8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_1a0,local_1a0 + local_198);
    Disconnect(this,(Error *)local_f0);
    if (local_e8._M_p != local_d8) {
      operator_delete(local_e8._M_p);
    }
  }
  if (local_1a0 != local_190) {
    operator_delete(local_1a0);
  }
  return;
}

Assistant:

void DtlsSession::HandleEvent(short aFlags)
{
    Error error;

    if (mIsServer && !mIsClientIdSet)
    {
        SuccessOrExit(error = SetClientTransportId());
    }

    switch (mState)
    {
    case State::kConnecting:
        error = Handshake();
        if (ShouldStop(error) || mState != State::kConnected)
        {
            break;
        }

        // Fall through

    case State::kConnected:
        if (aFlags & EV_READ)
        {
            while (error == ErrorCode::kNone)
            {
                error = Read();
            }
        }
        if ((aFlags & EV_WRITE) && !ShouldStop(error))
        {
            error = TryWrite();
        }
        break;

    default:
        // Ignore incoming data when the DTLS session is disconnected.

        LOG_DEBUG(LOG_REGION_DTLS, "session(={}) received event {:X} in state {}", static_cast<void *>(this), aFlags,
                  GetStateString());
        break;
    }

exit:
    if (ShouldStop(error))
    {
        Disconnect(error);
    }
}